

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.hpp
# Opt level: O3

PolynomialType * __thiscall
OpenMD::Polynomial<double>::operator+=(Polynomial<double> *this,PolynomialType *p)

{
  _Rb_tree_node_base *p_Var1;
  
  for (p_Var1 = (p->polyPairMap_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(p->polyPairMap_)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    addCoefficient(this,p_Var1[1]._M_color,(double *)&p_Var1[1]._M_parent);
  }
  return this;
}

Assistant:

PolynomialType& operator+=(const PolynomialType& p) {
      typename Polynomial<Real>::const_iterator i;

      for (i = p.begin(); i != p.end(); ++i) {
        this->addCoefficient(i->first, i->second);
      }

      return *this;
    }